

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stmt.h
# Opt level: O0

void __thiscall
enact::FunctionStmt::FunctionStmt
          (FunctionStmt *this,Token *name,
          unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
          *returnTypename,
          vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_> *params,
          unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *body)

{
  unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *body_local;
  vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_> *params_local;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
  *returnTypename_local;
  Token *name_local;
  FunctionStmt *this_local;
  
  Stmt::Stmt(&this->super_Stmt);
  (this->super_Stmt)._vptr_Stmt = (_func_int **)&PTR__FunctionStmt_00169f98;
  Token::Token(&this->name,name);
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::unique_ptr
            (&this->returnTypename,returnTypename);
  std::vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>::vector
            (&this->params,params);
  std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::unique_ptr
            (&this->body,body);
  return;
}

Assistant:

FunctionStmt(Token name, std::unique_ptr<const Typename> returnTypename, std::vector<Param> &&params,
                     std::unique_ptr<BlockExpr> body) :
                name{std::move(name)},
                returnTypename{std::move(returnTypename)},
                params{std::move(params)},
                body{std::move(body)} {}